

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasn1element.cpp
# Opt level: O0

bool __thiscall QAsn1Element::toBool(QAsn1Element *this,bool *ok)

{
  long lVar1;
  bool val;
  byte bVar2;
  undefined1 *in_RSI;
  QAsn1Element *in_RDI;
  long in_FS_OFFSET;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  bool in_stack_ffffffffffffff9f;
  undefined1 local_49;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fromBool(in_stack_ffffffffffffff9f);
  val = operator==(in_RDI,(QAsn1Element *)
                          CONCAT17(in_stack_ffffffffffffff8f,
                                   CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
  ~QAsn1Element((QAsn1Element *)0x11cf66);
  if ((val & 1U) == 0) {
    fromBool(val);
    bVar2 = operator==(in_RDI,(QAsn1Element *)
                              CONCAT17(in_stack_ffffffffffffff8f,
                                       CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)
                                      ));
    ~QAsn1Element((QAsn1Element *)0x11cfb0);
    if ((bVar2 & 1) == 0) {
      if (in_RSI != (undefined1 *)0x0) {
        *in_RSI = 0;
      }
      local_49 = false;
    }
    else {
      if (in_RSI != (undefined1 *)0x0) {
        *in_RSI = 1;
      }
      local_49 = false;
    }
  }
  else {
    if (in_RSI != (undefined1 *)0x0) {
      *in_RSI = 1;
    }
    local_49 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_49;
  }
  __stack_chk_fail();
}

Assistant:

bool QAsn1Element::toBool(bool *ok) const
{
    if (*this == fromBool(true)) {
        if (ok)
            *ok = true;
        return true;
    } else if (*this == fromBool(false)) {
        if (ok)
            *ok = true;
        return false;
    } else {
        if (ok)
            *ok = false;
        return false;
    }
}